

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_array.h
# Opt level: O0

void __thiscall
agg::pod_vector<agg::cell_aa_*>::capacity(pod_vector<agg::cell_aa_*> *this,uint cap,uint extra_tail)

{
  cell_aa **local_28;
  uint extra_tail_local;
  uint cap_local;
  pod_vector<agg::cell_aa_*> *this_local;
  
  this->m_size = 0;
  if (this->m_capacity < cap) {
    pod_allocator<agg::cell_aa_*>::deallocate(this->m_array,this->m_capacity);
    this->m_capacity = cap + extra_tail;
    if (this->m_capacity == 0) {
      local_28 = (cell_aa **)0x0;
    }
    else {
      local_28 = pod_allocator<agg::cell_aa_*>::allocate(this->m_capacity);
    }
    this->m_array = local_28;
  }
  return;
}

Assistant:

void pod_vector<T>::capacity(unsigned cap, unsigned extra_tail)
    {
        m_size = 0;
        if(cap > m_capacity)
        {
            pod_allocator<T>::deallocate(m_array, m_capacity);
            m_capacity = cap + extra_tail;
            m_array = m_capacity ? pod_allocator<T>::allocate(m_capacity) : 0;
        }
    }